

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kurtosis.cpp
# Opt level: O0

AggregateFunction * duckdb::KurtosisFun::GetFunction(void)

{
  AggregateFunction *in_RDI;
  AggregateFunction *result;
  FunctionNullHandling in_stack_000000af;
  LogicalType *in_stack_000000b0;
  LogicalType *in_stack_000000b8;
  AggregateFunction *pAVar1;
  LogicalType local_40 [24];
  LogicalType local_28 [31];
  undefined1 local_9;
  
  local_9 = 0;
  pAVar1 = in_RDI;
  duckdb::LogicalType::LogicalType(local_28,DOUBLE);
  duckdb::LogicalType::LogicalType(local_40,DOUBLE);
  AggregateFunction::
  UnaryAggregate<duckdb::KurtosisState,double,double,duckdb::KurtosisOperation<duckdb::KurtosisFlagBiasCorrection>,(duckdb::AggregateDestructorType)0>
            (in_stack_000000b8,in_stack_000000b0,in_stack_000000af);
  duckdb::LogicalType::~LogicalType(local_40);
  duckdb::LogicalType::~LogicalType(local_28);
  pAVar1->field_0xaa = 1;
  return in_RDI;
}

Assistant:

AggregateFunction KurtosisFun::GetFunction() {
	auto result =
	    AggregateFunction::UnaryAggregate<KurtosisState, double, double, KurtosisOperation<KurtosisFlagBiasCorrection>>(
	        LogicalType::DOUBLE, LogicalType::DOUBLE);
	result.errors = FunctionErrors::CAN_THROW_RUNTIME_ERROR;
	return result;
}